

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_endian.c
# Opt level: O1

void test_convert_htobe16(void)

{
  uint16_t check;
  uint16_t check_pattern;
  uint16_t local_c [2];
  
  local_c[1] = 0x1234;
  local_c[0] = cio_htobe16(0x3412);
  UnityAssertEqualMemory
            (local_c + 1,local_c,2,1,"16 bit endian conversion incorrect!",0x41,UNITY_ARRAY_TO_ARRAY
            );
  return;
}

Assistant:

static void test_convert_htobe16(void)
{
	uint8_t pattern_array[] = {0x12, 0x34};
	uint16_t pattern;
	memcpy(&pattern, pattern_array, sizeof(pattern));
	uint16_t check_pattern = 0x1234;

	uint16_t check = cio_htobe16(pattern);

	TEST_ASSERT_EQUAL_MEMORY_MESSAGE(&check_pattern, &check, sizeof(check), "16 bit endian conversion incorrect!");
}